

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraverser.h
# Opt level: O0

void __thiscall glslang::TLiveTraverser::pushGlobalReference(TLiveTraverser *this,TString *name)

{
  bool bVar1;
  int iVar2;
  TOperator TVar3;
  TIntermNode *pTVar4;
  undefined4 extraout_var;
  ulong uVar5;
  size_type sVar6;
  reference ppTVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__lhs;
  TIntermSymbol *symbol;
  TIntermBinary *binary;
  TIntermAggregate *candidate;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvStack_20;
  uint f;
  TIntermSequence *globals;
  TString *name_local;
  TLiveTraverser *this_local;
  
  globals = (TIntermSequence *)name;
  name_local = (TString *)this;
  pTVar4 = TIntermediate::getTreeRoot(this->intermediate);
  iVar2 = (*pTVar4->_vptr_TIntermNode[6])();
  pvStack_20 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 400))();
  candidate._4_4_ = 0;
  do {
    uVar5 = (ulong)candidate._4_4_;
    sVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvStack_20);
    if (sVar6 <= uVar5) {
      return;
    }
    ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (pvStack_20,(ulong)candidate._4_4_);
    iVar2 = (*(*ppTVar7)->_vptr_TIntermNode[6])();
    binary = (TIntermBinary *)CONCAT44(extraout_var_00,iVar2);
    if ((binary != (TIntermBinary *)0x0) &&
       (TVar3 = TIntermOperator::getOp((TIntermOperator *)binary), TVar3 == EOpSequence)) {
      iVar2 = (*(binary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      sVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                        ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                         CONCAT44(extraout_var_01,iVar2));
      if (sVar6 == 1) {
        iVar2 = (*(binary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                             CONCAT44(extraout_var_02,iVar2),0);
        iVar2 = (*(*ppTVar7)->_vptr_TIntermNode[8])();
        if (CONCAT44(extraout_var_03,iVar2) != 0) {
          iVar2 = (*(binary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])();
          ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                              ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                               CONCAT44(extraout_var_04,iVar2),0);
          iVar2 = (*(*ppTVar7)->_vptr_TIntermNode[8])();
          plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 400))();
          plVar8 = (long *)(**(code **)(*plVar8 + 0x60))();
          if ((plVar8 != (long *)0x0) &&
             (lVar9 = (**(code **)(*plVar8 + 0x108))(),
             ((uint)*(undefined8 *)(lVar9 + 8) & 0x7f) == 1)) {
            __lhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(*plVar8 + 400))();
            bVar1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                           *)globals);
            if (bVar1) {
              std::__cxx11::
              list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>::
              push_back(&this->destinations,(value_type *)&binary);
              return;
            }
          }
        }
      }
    }
    candidate._4_4_ = candidate._4_4_ + 1;
  } while( true );
}

Assistant:

void pushGlobalReference(const TString& name)
    {
        TIntermSequence& globals = intermediate.getTreeRoot()->getAsAggregate()->getSequence();
        for (unsigned int f = 0; f < globals.size(); ++f) {
            TIntermAggregate* candidate = globals[f]->getAsAggregate();
            if (candidate && candidate->getOp() == EOpSequence &&
                candidate->getSequence().size() == 1 &&
                candidate->getSequence()[0]->getAsBinaryNode()) {
                TIntermBinary* binary = candidate->getSequence()[0]->getAsBinaryNode();
                TIntermSymbol* symbol = binary->getLeft()->getAsSymbolNode();
                if (symbol && symbol->getQualifier().storage == EvqGlobal &&
                    symbol->getName() == name) {
                    destinations.push_back(candidate);
                    break;
                }
            }
        }
    }